

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::equipCards(Player *this)

{
  Stronghold *pSVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  int iVar5;
  list<BlackCard_*,_std::allocator<BlackCard_*>_> *this_00;
  ostream *poVar6;
  istream *piVar7;
  GreenCard *pGVar8;
  Personality *this_01;
  byte local_109;
  string local_b8 [32];
  Personality *local_98;
  BlackCard *location;
  GreenCard *local_70;
  GreenCard *bought;
  char local_51;
  string local_50 [7];
  char ans;
  string pers;
  string local_30 [8];
  string equip;
  Player *this_local;
  
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  bVar2 = Deck::isEmpty(&this->hand);
  if (bVar2) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Hand empty. Can\'t equip cards now");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    bought._0_4_ = 1;
  }
  else {
    this_00 = DynastyDeck::getDynDeck_abi_cxx11_(&this->army);
    bVar2 = std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::empty(this_00);
    if (bVar2) {
      poVar6 = std::operator<<((ostream *)&std::cout,"No army. Can\'t equip cards now");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      bought._0_4_ = 1;
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,"Do you want to equip a card?");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<(poVar6,"Enter y for yes, n for no");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::operator>>((istream *)&std::cin,&local_51);
      while( true ) {
        local_109 = 0;
        if (local_51 == 'y') {
          bVar2 = Deck::isEmpty(&this->hand);
          local_109 = bVar2 ^ 0xff;
        }
        if ((local_109 & 1) == 0) break;
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "Enter name of card to equip and which personality will equip it");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        piVar7 = std::operator>>((istream *)&std::cin,local_30);
        std::operator>>(piVar7,local_50);
        std::__cxx11::string::string((string *)&location,local_30);
        pGVar8 = (GreenCard *)Deck::searchDeck(&this->hand,(string *)&location);
        std::__cxx11::string::~string((string *)&location);
        local_70 = pGVar8;
        std::__cxx11::string::string(local_b8,local_50);
        this_01 = (Personality *)DynastyDeck::searchDeck(&this->provinces,(string *)local_b8);
        std::__cxx11::string::~string(local_b8);
        local_98 = this_01;
        if (local_70 == (GreenCard *)0x0) {
          poVar6 = std::operator<<((ostream *)&std::cout,"Invalid hand card");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
        else if (this_01 == (Personality *)0x0) {
          poVar6 = std::operator<<((ostream *)&std::cout,"Invalid personality");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
        else {
          TVar3 = Card::getType((Card *)this_01);
          if (TVar3 == PERSONALITY) {
            iVar4 = Stronghold::getMoney(this->stronghold);
            iVar5 = (*(local_70->super_Card)._vptr_Card[4])();
            if (iVar4 < iVar5) {
              poVar6 = std::operator<<((ostream *)&std::cout,"Not enough money");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            }
            else {
              bVar2 = BlackCard::isTapped(&local_98->super_BlackCard);
              if (bVar2) {
                poVar6 = std::operator<<((ostream *)&std::cout,"Personality tapped");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              }
              else {
                pSVar1 = this->stronghold;
                iVar4 = Stronghold::getMoney(pSVar1);
                iVar5 = (*(local_70->super_Card)._vptr_Card[4])();
                Stronghold::setMoney(pSVar1,iVar4 - iVar5);
                pGVar8 = local_70;
                pSVar1 = this->stronghold;
                iVar4 = Stronghold::getMoney(pSVar1);
                iVar4 = GreenCard::addBonus(pGVar8,iVar4,this->honour);
                Stronghold::setMoney(pSVar1,iVar4);
                Personality::PushGreenCard(local_98,local_70);
                poVar6 = std::operator<<((ostream *)&std::cout,"Card successfully equiped");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              }
            }
          }
          else {
            poVar6 = std::operator<<((ostream *)&std::cout,"Invalid card, not a personality");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          }
        }
        if (local_70 != (GreenCard *)0x0) {
          (*(local_70->super_Card)._vptr_Card[3])();
        }
        if (local_98 != (Personality *)0x0) {
          (*(local_98->super_BlackCard).super_Card._vptr_Card[3])();
        }
        poVar6 = std::operator<<((ostream *)&std::cout,"Do you want to equip more cards?");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(poVar6,"Enter y for yes, n for no");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::operator>>((istream *)&std::cin,&local_51);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      bought._0_4_ = 0;
    }
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Player::equipCards()                                   //player can equip any green cards from his hand to his provinces and personalities if he wants to
{
    string equip, pers;
    char ans;

    if (hand.isEmpty())
    {
        cout << "Hand empty. Can't equip cards now" <<endl<<endl;
        return;
    }
    if (army.getDynDeck().empty())
    {
        cout << "No army. Can't equip cards now" <<endl<<endl;
        return;
    }

    cout << "Do you want to equip a card?"<<endl<<"Enter y for yes, n for no"<<endl;
    cin >> ans;

    while (ans == 'y' && !hand.isEmpty())
    {
        cout << "Enter name of card to equip and which personality will equip it" << endl;
        cin >> equip >> pers;

        GreenCard *bought = reinterpret_cast<GreenCard*>(hand.searchDeck(equip));
        BlackCard *location = reinterpret_cast<BlackCard*>(provinces.searchDeck(pers));

        if (!bought)
            cout << "Invalid hand card"<<endl;
        else if (!location)
            cout << "Invalid personality"<<endl;
        else if (location->getType() != Card::PERSONALITY)
            cout << "Invalid card, not a personality"<<endl;
        else if (stronghold->getMoney() < bought->getCost())
            cout << "Not enough money"<<endl;
        else if (location->isTapped())
            cout <<"Personality tapped"<<endl;
        else
        {
            stronghold->setMoney(stronghold->getMoney() - bought->getCost());           //pay
            stronghold->setMoney(bought->addBonus(stronghold->getMoney(), honour));     //add bonus if player wants

            reinterpret_cast<Personality*>(location)->PushGreenCard(bought);                   //add it to personality's followers or items
            cout << "Card successfully equiped"<<endl;
        }
        delete bought;
        delete location;

        cout << "Do you want to equip more cards?"<<endl<<"Enter y for yes, n for no"<<endl;
        cin >> ans;
    }
    cout<<endl;
}